

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_specialization_constants_and_structs(CompilerMSL *this)

{
  BaseType BVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  Types TVar6;
  uint32_t uVar7;
  SPIRConstant *pSVar8;
  SPIRType *pSVar9;
  size_type sVar10;
  TypedID *pTVar11;
  SPIRType *pSVar12;
  string *ts_1;
  SPIRConstantOp *pSVar13;
  size_type sVar14;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar15;
  bool local_5a4;
  bool local_5a3;
  bool local_5a1;
  bool local_59f;
  byte local_59d;
  allocator local_479;
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [36];
  undefined4 local_3f4;
  SPIRType *local_3f0;
  SPIRType *type_3;
  SPIRUndef *undef;
  undefined1 local_3d8;
  uint32_t local_3cc;
  uint32_t local_3c8;
  byte local_3c2;
  bool local_3c1;
  uint32_t local_3c0;
  bool is_declarable_struct;
  ID IStack_3bc;
  bool is_builtin_block;
  bool local_3b6;
  byte local_3b5;
  uint32_t local_3b4;
  bool is_block;
  bool is_struct;
  SPIRType *pSStack_3b0;
  TypeID type_id;
  SPIRType *type_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [32];
  string local_368 [8];
  string name;
  SPIRType *type_1;
  SPIRConstantOp *c_1;
  _Node_iterator_base<unsigned_int,_false> local_318;
  undefined1 local_310;
  undefined1 local_308 [32];
  undefined1 local_2e8 [48];
  uint32_t constant_id_1;
  undefined1 local_298 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [8];
  string sc_tmp_name;
  BaseType sc_tmp_type;
  pair<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_> local_21c;
  uint32_t local_214;
  uint32_t local_210;
  uint32_t local_20c;
  uint32_t constant_id;
  string sc_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [8];
  string sc_type_name;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  SPIRConstant *local_180;
  SPIRConstant *c;
  Variant *id;
  TypedID<(spirv_cross::Types)0> *id_;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  unique_func_constants;
  undefined1 local_100 [8];
  LoopLock loop_lock;
  anon_class_8_1_8991fb9c aStack_e0;
  bool builtin_block_type_is_required;
  undefined1 local_d8 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  aligned_structs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  declared_structs;
  bool emitted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  SPIREntryPoint *local_38;
  SPIREntryPoint *execution;
  ID workgroup_size_id;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  CompilerMSL *this_local;
  
  SpecializationConstant::SpecializationConstant(&wg_y);
  SpecializationConstant::SpecializationConstant(&wg_z);
  SpecializationConstant::SpecializationConstant((SpecializationConstant *)&stack0xffffffffffffffd8)
  ;
  uVar5 = Compiler::get_work_group_size_specialization_constants
                    ((Compiler *)this,&wg_y,&wg_z,(SpecializationConstant *)&stack0xffffffffffffffd8
                    );
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&execution + 4),uVar5);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&execution + 4));
  if ((uVar5 == 0) && (bVar2 = is_mesh_shader(this), bVar2)) {
    local_38 = Compiler::get_entry_point((Compiler *)this);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_58,this,0x19,4);
    CompilerGLSL::
    statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],char_const(&)[7],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",local_58,
               (char (*) [21])" [[maybe_unused]] = ",(char (*) [7])0x424e4b,
               &(local_38->workgroup_size).x,(char (*) [3])0x421228,&(local_38->workgroup_size).y,
               (char (*) [3])0x421228,&(local_38->workgroup_size).z,(char (*) [3])0x40acad);
    ::std::__cxx11::string::~string((string *)local_58);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  }
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&aligned_structs._M_h._M_single_bucket);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_d8);
  aStack_e0.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerMSL::emit_specialization_constants_and_structs()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&stack0xffffffffffffff20);
  bVar3 = is_mesh_shader(this);
  loop_lock.lock = (uint32_t *)this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRConstant,spirv_cross::CompilerMSL::emit_specialization_constants_and_structs()::__1>
            (&(this->super_CompilerGLSL).super_Compiler.ir,(anon_class_16_2_94938598 *)&loop_lock);
  ParsedIR::create_loop_soft_lock((ParsedIR *)local_100);
  unique_func_constants._M_h._M_single_bucket =
       (__node_base_ptr)&aligned_structs._M_h._M_single_bucket;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerMSL::emit_specialization_constants_and_structs()::__2>
            (&(this->super_CompilerGLSL).super_Compiler.ir,
             (anon_class_24_3_139e5662 *)&unique_func_constants._M_h._M_single_bucket);
  bVar2 = false;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)&aligned_structs._M_h._M_single_bucket);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                   *)&__range1);
  __begin1 = (TypedID<(spirv_cross::Types)0> *)
             &(this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  id_ = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  do {
    if (__end1 == id_) {
      if (bVar2) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
      }
      local_3f4 = 0;
LAB_002b56ba:
      ::std::
      unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                        *)&__range1);
      ParsedIR::LoopLock::~LoopLock((LoopLock *)local_100);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)local_d8);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&aligned_structs._M_h._M_single_bucket);
      return;
    }
    id = (Variant *)__end1;
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    c = (SPIRConstant *)
        VectorView<spirv_cross::Variant>::operator[]
                  (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>,(ulong)uVar5);
    TVar6 = Variant::get_type((Variant *)c);
    if (TVar6 == TypeConstant) {
      local_180 = Variant::get<spirv_cross::SPIRConstant>((Variant *)c);
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_180->super_IVariant).self);
      uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&execution + 4));
      if (uVar5 == uVar7) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_1a0,this,0x19,4);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&execution + 4));
        pSVar8 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar5);
        CompilerGLSL::constant_expression_abi_cxx11_
                  ((CompilerGLSL *)&type,(SPIRConstant *)this,SUB81(pSVar8,0),false);
        CompilerGLSL::
        statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",local_1a0,
                   (char (*) [21])" [[maybe_unused]] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)&type);
        ::std::__cxx11::string::~string((string *)local_1a0);
        bVar2 = true;
      }
      else if ((local_180->specialization & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_180->super_IVariant).field_0xc);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_1e8,this,pSVar9,0);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_180->super_IVariant).self)
        ;
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_180->super_IVariant).self)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&constant_id,this,(ulong)uVar5);
        bVar2 = Options::supports_msl_version(&this->msl_options,1,2,0);
        if (bVar2) {
          local_20c = (local_180->super_IVariant).self.id;
          bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_20c,DecorationSpecId);
          if ((!bVar2) || ((local_180->is_used_as_array_length & 1U) != 0)) goto LAB_002b4997;
          local_214 = (local_180->super_IVariant).self.id;
          local_210 = Compiler::get_decoration((Compiler *)this,(ID)local_214,DecorationSpecId);
          sVar10 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                   ::count((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                            *)&__range1,&local_210);
          if (sVar10 == 0) {
            local_21c = ::std::make_pair<unsigned_int&,spirv_cross::TypedID<(spirv_cross::Types)0>&>
                                  (&local_210,&(local_180->super_IVariant).self);
            ::std::
            unordered_map<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)3>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>>
            ::insert<std::pair<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)0>>>
                      ((unordered_map<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)3>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>>
                        *)&__range1,&local_21c);
          }
          pTVar11 = (TypedID *)
                    ::std::
                    unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                    ::operator[]((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                                  *)&__range1,&local_210);
          uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar11);
          pSVar12 = Compiler::expression_type((Compiler *)this,uVar5);
          BVar1 = pSVar12->basetype;
          pTVar11 = (TypedID *)
                    ::std::
                    unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                    ::operator[]((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                                  *)&__range1,&local_210);
          uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar11);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_298 + 0x20,this,(ulong)uVar5,1);
          ::std::operator+(local_258,local_298 + 0x20);
          ::std::__cxx11::string::~string((string *)(local_298 + 0x20));
          pTVar11 = (TypedID *)
                    ::std::
                    unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                    ::operator[]((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                                  *)&__range1,&local_210);
          uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar11);
          uVar7 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_180->super_IVariant).self);
          if (uVar5 == uVar7) {
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[22],unsigned_int&,char_const(&)[5]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",local_1e8,
                       (char (*) [2])0x40c6cb,local_258,(char (*) [22])0x4180b5,&local_210,
                       (char (*) [5])")]];");
          }
          CompilerGLSL::bitcast_expression
                    ((CompilerGLSL *)local_298,(SPIRType *)this,(BaseType)pSVar9,
                     (string *)(ulong)BVar1);
          CompilerGLSL::constant_expression_abi_cxx11_
                    ((CompilerGLSL *)&constant_id_1,(SPIRConstant *)this,SUB81(local_180,0),false);
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[33],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"constant ",local_1e8,
                     (char (*) [2])0x40c6cb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &constant_id,(char (*) [33])" = is_function_constant_defined(",local_258,
                     (char (*) [5])0x418139,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     (char (*) [4])0x412b5f,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &constant_id_1,(char (*) [2])0x42463b);
          ::std::__cxx11::string::~string((string *)&constant_id_1);
          ::std::__cxx11::string::~string((string *)local_298);
          ::std::__cxx11::string::~string((string *)local_258);
        }
        else {
LAB_002b4997:
          local_2e8._44_4_ = (local_180->super_IVariant).self.id;
          bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_2e8._44_4_,DecorationSpecId);
          if (bVar2) {
            local_2e8._36_4_ = (local_180->super_IVariant).self.id;
            local_2e8._40_4_ =
                 Compiler::get_decoration((Compiler *)this,(ID)local_2e8._36_4_,DecorationSpecId);
            CompilerGLSL::constant_value_macro_name_abi_cxx11_
                      ((CompilerGLSL *)local_2e8,(uint32_t)this);
            ::std::__cxx11::string::operator=
                      ((string *)&local_180->specialization_constant_macro_name,(string *)local_2e8)
            ;
            ::std::__cxx11::string::~string((string *)local_2e8);
            CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                      (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",
                       &local_180->specialization_constant_macro_name);
            ts_1 = &local_180->specialization_constant_macro_name;
            CompilerGLSL::constant_expression_abi_cxx11_
                      ((CompilerGLSL *)local_308,(SPIRConstant *)this,SUB81(local_180,0),false);
            CompilerGLSL::
            statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                      (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1,
                       (char (*) [2])0x40c6cb,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308);
            ::std::__cxx11::string::~string((string *)local_308);
            CompilerGLSL::statement<char_const(&)[7]>
                      (&this->super_CompilerGLSL,(char (*) [7])"#endif");
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",local_1e8,
                       (char (*) [2])0x40c6cb,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &constant_id,(char (*) [4])0x4247a7,
                       &local_180->specialization_constant_macro_name,(char (*) [2])0x42463b);
            pVar15 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert(&this->constant_macro_ids,(value_type *)(local_2e8 + 0x28));
            local_318._M_cur =
                 (__node_type *)pVar15.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
            local_310 = pVar15.second;
          }
          else {
            CompilerGLSL::constant_expression_abi_cxx11_
                      ((CompilerGLSL *)&c_1,(SPIRConstant *)this,SUB81(local_180,0),false);
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",local_1e8,
                       (char (*) [2])0x40c6cb,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &constant_id,(char (*) [4])0x4247a7,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c_1,
                       (char (*) [2])0x42463b);
            ::std::__cxx11::string::~string((string *)&c_1);
          }
        }
        bVar2 = true;
        ::std::__cxx11::string::~string((string *)&constant_id);
        ::std::__cxx11::string::~string((string *)local_1e8);
      }
    }
    else {
      TVar6 = Variant::get_type((Variant *)c);
      if (TVar6 == TypeConstantOp) {
        pSVar13 = Variant::get<spirv_cross::SPIRConstantOp>((Variant *)c);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar13->basetype);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar13->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar13->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_368,this,(ulong)uVar5,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (local_388,this,pSVar9,local_368,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&type_2,this,pSVar13);
        CompilerGLSL::
        statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [10])"constant ",local_388,
                   (char (*) [4])0x4247a7,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type_2,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)&type_2);
        ::std::__cxx11::string::~string((string *)local_388);
        bVar2 = true;
        ::std::__cxx11::string::~string(local_368);
      }
      else {
        TVar6 = Variant::get_type((Variant *)c);
        if (TVar6 == TypeType) {
          pSStack_3b0 = Variant::get<spirv_cross::SPIRType>((Variant *)c);
          local_3b4 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_3b0->super_IVariant).self);
          local_59d = 0;
          if (pSStack_3b0->basetype == Struct) {
            bVar4 = VectorView<unsigned_int>::empty
                              (&(pSStack_3b0->array).super_VectorView<unsigned_int>);
            local_59d = 0;
            if (bVar4) {
              local_59d = pSStack_3b0->pointer ^ 0xff;
            }
          }
          local_3b5 = local_59d & 1;
          IStack_3bc.id = (pSStack_3b0->super_IVariant).self.id;
          bVar4 = Compiler::has_decoration((Compiler *)this,IStack_3bc,DecorationBlock);
          local_59f = true;
          if (!bVar4) {
            local_3c0 = (pSStack_3b0->super_IVariant).self.id;
            local_59f = Compiler::has_decoration
                                  ((Compiler *)this,(ID)local_3c0,DecorationBufferBlock);
          }
          local_3b6 = local_59f;
          local_5a1 = false;
          if (local_59f != false) {
            local_5a1 = Compiler::is_builtin_type((Compiler *)this,pSStack_3b0);
          }
          local_3c1 = local_5a1;
          local_5a3 = false;
          if ((local_3b5 & 1) != 0) {
            local_5a4 = true;
            if (local_5a1 != false) {
              local_5a4 = bVar3;
            }
            local_5a3 = local_5a4;
          }
          local_3c2 = local_5a3;
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
          if (uVar5 != 0) {
            pSVar9 = get_stage_out_struct_type(this);
            uVar5 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar9->super_IVariant).self);
            uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            if (uVar5 == uVar7) {
              local_3c2 = 0;
            }
          }
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_out_var_id);
          if (uVar5 != 0) {
            pSVar9 = get_patch_stage_out_struct_type(this);
            uVar5 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar9->super_IVariant).self);
            uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            if (uVar5 == uVar7) {
              local_3c2 = 0;
            }
          }
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
          if (uVar5 != 0) {
            pSVar9 = get_stage_in_struct_type(this);
            uVar5 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar9->super_IVariant).self);
            uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            if (uVar5 == uVar7) {
              local_3c2 = 0;
            }
          }
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_in_var_id);
          if (uVar5 != 0) {
            pSVar9 = get_patch_stage_in_struct_type(this);
            uVar5 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar9->super_IVariant).self);
            uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            if (uVar5 == uVar7) {
              local_3c2 = 0;
            }
          }
          uVar5 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&this->stage_out_masked_builtin_type_id);
          uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
          if (uVar5 == uVar7) {
            local_3c2 = 1;
          }
          bVar4 = false;
          if ((local_3c2 & 1) != 0) {
            local_3c8 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            sVar14 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&aligned_structs._M_h._M_single_bucket,&local_3c8);
            bVar4 = sVar14 == 0;
          }
          if (bVar4) {
            if (bVar2) {
              CompilerGLSL::statement<char_const(&)[1]>
                        (&this->super_CompilerGLSL,(char (*) [1])0x400321);
            }
            bVar2 = false;
            local_3cc = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            pVar15 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)&aligned_structs._M_h._M_single_bucket,&local_3cc);
            undef = (SPIRUndef *)pVar15.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
            local_3d8 = pVar15.second;
            uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            bVar4 = Compiler::has_extended_decoration
                              ((Compiler *)this,uVar5,SPIRVCrossDecorationBufferBlockRepacked);
            if (bVar4) {
              align_struct(this,pSStack_3b0,
                           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)local_d8);
            }
            uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3b4);
            pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar9);
          }
        }
        else {
          TVar6 = Variant::get_type((Variant *)c);
          if (TVar6 == TypeUndef) {
            type_3 = (SPIRType *)Variant::get<spirv_cross::SPIRUndef>((Variant *)c);
            uVar5 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(type_3->super_IVariant).field_0xc);
            pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            local_3f0 = pSVar9;
            if (pSVar9->basetype == Void) {
              local_3f4 = 1;
              goto LAB_002b56ba;
            }
            uVar5 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(type_3->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_458,this,(ulong)uVar5,1);
            TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_3->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                      (local_438,this,pSVar9,local_458);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_478,"constant",&local_479);
            inject_top_level_storage_qualifier(local_418,local_438);
            CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                      (&this->super_CompilerGLSL,local_418,(char (*) [7])0x4244d6);
            ::std::__cxx11::string::~string((string *)local_418);
            ::std::__cxx11::string::~string(local_478);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
            ::std::__cxx11::string::~string((string *)local_438);
            ::std::__cxx11::string::~string(local_458);
            bVar2 = true;
          }
        }
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::emit_specialization_constants_and_structs()
{
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);
	if (workgroup_size_id == 0 && is_mesh_shader())
	{
		auto &execution = get_entry_point();
		statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
		          " [[maybe_unused]] = ", "uint3(", execution.workgroup_size.x, ", ", execution.workgroup_size.y, ", ",
		          execution.workgroup_size.z, ");");
		statement("");
	}

	bool emitted = false;
	unordered_set<uint32_t> declared_structs;
	unordered_set<uint32_t> aligned_structs;

	// First, we need to deal with scalar block layout.
	// It is possible that a struct may have to be placed at an alignment which does not match the innate alignment of the struct itself.
	// In that case, if such a case exists for a struct, we must force that all elements of the struct become packed_ types.
	// This makes the struct alignment as small as physically possible.
	// When we actually align the struct later, we can insert padding as necessary to make the packed members behave like normally aligned types.
	ir.for_each_typed_id<SPIRType>([&](uint32_t type_id, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
			mark_scalar_layout_structs(type);
	});

	bool builtin_block_type_is_required = is_mesh_shader();
	// Very special case. If gl_PerVertex is initialized as an array (tessellation)
	// we have to potentially emit the gl_PerVertex struct type so that we can emit a constant LUT.
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		auto &type = this->get<SPIRType>(c.constant_type);
		if (is_array(type) && has_decoration(type.self, DecorationBlock) && is_builtin_type(type))
			builtin_block_type_is_required = true;
	});

	// Very particular use of the soft loop lock.
	// align_struct may need to create custom types on the fly, but we don't care about
	// these types for purpose of iterating over them in ir.ids_for_type and friends.
	auto loop_lock = ir.create_loop_soft_lock();

	// Physical storage buffer pointers can have cyclical references,
	// so emit forward declarations of them before other structs.
	// Ignore type_id because we want the underlying struct type from the pointer.
	ir.for_each_typed_id<SPIRType>([&](uint32_t /* type_id */, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
			type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
			declared_structs.count(type.self) == 0)
		{
			statement("struct ", to_name(type.self), ";");
			declared_structs.insert(type.self);
			emitted = true;
		}
	});
	if (emitted)
		statement("");

	emitted = false;
	declared_structs.clear();

	// It is possible to have multiple spec constants that use the same spec constant ID.
	// The most common cause of this is defining spec constants in GLSL while also declaring
	// the workgroup size to use those spec constants. But, Metal forbids declaring more than
	// one variable with the same function constant ID.
	// In this case, we must only declare one variable with the [[function_constant(id)]]
	// attribute, and use its initializer to initialize all the spec constants with
	// that ID.
	std::unordered_map<uint32_t, ConstantID> unique_func_constants;

	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				// TODO: This can be expressed as a [[threads_per_threadgroup]] input semantic, but we need to know
				// the work group size at compile time in SPIR-V, and [[threads_per_threadgroup]] would need to be passed around as a global.
				// The work group size may be a specialization constant.
				statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
				          " [[maybe_unused]] = ", constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				string sc_type_name = type_to_glsl(type);
				add_resource_name(c.self);
				string sc_name = to_name(c.self);

				// Function constants are only supported in MSL 1.2 and later.
				// If we don't support it just declare the "default" directly.
				// This "default" value can be overridden to the true specialization constant by the API user.
				// Specialization constants which are used as array length expressions cannot be function constants in MSL,
				// so just fall back to macros.
				if (msl_options.supports_msl_version(1, 2) && has_decoration(c.self, DecorationSpecId) &&
				    !c.is_used_as_array_length)
				{
					// Only scalar, non-composite values can be function constants.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					if (!unique_func_constants.count(constant_id))
						unique_func_constants.insert(make_pair(constant_id, c.self));
					SPIRType::BaseType sc_tmp_type = expression_type(unique_func_constants[constant_id]).basetype;
					string sc_tmp_name = to_name(unique_func_constants[constant_id]) + "_tmp";
					if (unique_func_constants[constant_id] == c.self)
						statement("constant ", sc_type_name, " ", sc_tmp_name, " [[function_constant(", constant_id,
						          ")]];");
					statement("constant ", sc_type_name, " ", sc_name, " = is_function_constant_defined(", sc_tmp_name,
					          ") ? ", bitcast_expression(type, sc_tmp_type, sc_tmp_name), " : ", constant_expression(c),
					          ";");
				}
				else if (has_decoration(c.self, DecorationSpecId))
				{
					// Fallback to macro overrides.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					c.specialization_constant_macro_name =
					    constant_value_macro_name(constant_id);

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("constant ", sc_type_name, " ", sc_name, " = ", c.specialization_constant_macro_name,
					          ";");

					// Record the usage of macro
					constant_macro_ids.insert(constant_id);
				}
				else
				{
					// Composite specialization constants must be built from other specialization constants.
					statement("constant ", sc_type_name, " ", sc_name, " = ", constant_expression(c), ";");
				}
				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			// Output non-builtin interface structs. These include local function structs
			// and structs nested within uniform and read-write buffers.
			auto &type = id.get<SPIRType>();
			TypeID type_id = type.self;

			bool is_struct = (type.basetype == SPIRType::Struct) && type.array.empty() && !type.pointer;
			bool is_block =
			    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

			bool is_builtin_block = is_block && is_builtin_type(type);
			bool is_declarable_struct = is_struct && (!is_builtin_block || builtin_block_type_is_required);

			// We'll declare this later.
			if (stage_out_var_id && get_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_out_var_id && get_patch_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (stage_in_var_id && get_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_in_var_id && get_patch_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;

			// Special case. Declare builtin struct anyways if we need to emit a threadgroup version of it.
			if (stage_out_masked_builtin_type_id == type_id)
				is_declarable_struct = true;

			// Align and emit declarable structs...but avoid declaring each more than once.
			if (is_declarable_struct && declared_structs.count(type_id) == 0)
			{
				if (emitted)
					statement("");
				emitted = false;

				declared_structs.insert(type_id);

				if (has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
					align_struct(type, aligned_structs);

				// Make sure we declare the underlying struct type, and not the "decorated" type with pointers, etc.
				emit_struct(get<SPIRType>(type_id));
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			// Undefined global memory is not allowed in MSL.
			// Declare constant and init to zeros. Use {}, as global constructors can break Metal.
			statement(
			    inject_top_level_storage_qualifier(variable_decl(type, to_name(undef.self), undef.self), "constant"),
			    " = {};");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}